

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O1

UInt32 Range_DecodeBit(void *pp,UInt32 size0)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = *(uint *)((long)pp + 0x1c);
  uVar2 = (*(uint *)((long)pp + 0x18) >> 0xe) * size0;
  bVar3 = uVar2 <= uVar1;
  if (bVar3) {
    *(uint *)((long)pp + 0x1c) = uVar1 - uVar2;
    uVar2 = *(uint *)((long)pp + 0x18) - uVar2;
  }
  *(uint *)((long)pp + 0x18) = uVar2;
  Range_Normalize((CPpmd7z_RangeDec *)pp);
  return (uint)bVar3;
}

Assistant:

static UInt32 Range_DecodeBit(void *pp, UInt32 size0)
{
  CPpmd7z_RangeDec *p = (CPpmd7z_RangeDec *)pp;
  UInt32 newBound = (p->Range >> 14) * size0;
  UInt32 symbol;
  if (p->Code < newBound)
  {
    symbol = 0;
    p->Range = newBound;
  }
  else
  {
    symbol = 1;
    p->Code -= newBound;
    p->Range -= newBound;
  }
  Range_Normalize(p);
  return symbol;
}